

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

bool __thiscall cmUVProcessChain::InternalData::Finish(InternalData *this)

{
  bool bVar1;
  int iVar2;
  uv_stream_t *puVar3;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  int __oflag;
  int __oflag_00;
  uv_pipe_ptr tmpPipe;
  uv_handle_ptr_base_<uv_pipe_s> local_28;
  
  if ((this->Builder->Stdio)._M_elems[1].Type == Builtin) {
    puVar3 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                       (&(this->OutputStreamData).super_BasicStreamData.BuiltinStream);
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::open
              ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)&this->OutputStreamData,
               (char *)puVar3,__oflag);
  }
  if ((this->Builder->Stdio)._M_elems[2].Type == Builtin) {
    local_28.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = ::cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&this->Loop);
    iVar2 = ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_28,(EVP_PKEY_CTX *)ctx);
    if (-1 < iVar2) {
      handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                         ((uv_handle_ptr_<uv_pipe_s> *)&local_28);
      iVar2 = uv_pipe_open(handle,(this->ErrorStreamData).super_BasicStreamData.Stdio.data.fd);
      if (-1 < iVar2) {
        ::cm::uv_handle_ptr_base_<uv_pipe_s>::reset(&local_28);
        puVar3 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                           (&(this->ErrorStreamData).super_BasicStreamData.BuiltinStream);
        cmBasicUVStreambuf<char,_std::char_traits<char>_>::open
                  ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)&this->ErrorStreamData,
                   (char *)puVar3,__oflag_00);
        ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_28);
        goto LAB_00212e1d;
      }
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_28);
    bVar1 = false;
  }
  else {
LAB_00212e1d:
    this->Valid = true;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmUVProcessChain::InternalData::Finish()
{
  if (this->Builder->Stdio[cmUVProcessChainBuilder::Stream_OUTPUT].Type ==
      cmUVProcessChainBuilder::Builtin) {
    this->OutputStreamData.Streambuf.open(
      this->OutputStreamData.BuiltinStream);
  }

  if (this->Builder->Stdio[cmUVProcessChainBuilder::Stream_ERROR].Type ==
      cmUVProcessChainBuilder::Builtin) {
    cm::uv_pipe_ptr tmpPipe;
    if (tmpPipe.init(*this->Loop, 0) < 0) {
      return false;
    }
    if (uv_pipe_open(tmpPipe, this->ErrorStreamData.Stdio.data.fd) < 0) {
      return false;
    }
    tmpPipe.reset();

    this->ErrorStreamData.Streambuf.open(this->ErrorStreamData.BuiltinStream);
  }

  this->Valid = true;
  return true;
}